

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compress_fragment_two_pass.cc
# Opt level: O2

void brotli::StoreCommands
               (uint8_t *literals,size_t num_literals,uint32_t *commands,size_t num_commands,
               size_t *storage_ix,uint8_t *storage)

{
  uint8_t *depth;
  uint8_t uVar1;
  uint uVar2;
  int iVar3;
  size_t i;
  size_t sVar4;
  long lVar5;
  uint uVar6;
  size_t i_1;
  bool bVar7;
  uint8_t cmd_depths [128];
  uint16_t local_db8 [4];
  uint16_t auStack_db0 [4];
  uint16_t local_da8 [4];
  uint16_t auStack_da0 [4];
  uint16_t local_d98 [4];
  uint16_t auStack_d90 [4];
  uint16_t local_d88 [4];
  uint16_t auStack_d80 [4];
  uint16_t local_d78 [4];
  uint16_t auStack_d70 [4];
  uint16_t local_d68 [4];
  uint16_t auStack_d60 [4];
  uint16_t local_d58 [4];
  uint16_t auStack_d50 [4];
  uint16_t local_d48 [4];
  uint16_t auStack_d40 [4];
  uint16_t local_d38 [64];
  uint8_t cmd_depth [64];
  uint8_t lit_depths [256];
  uint32_t local_b78;
  undefined8 local_b74;
  uint32_t local_a78 [20];
  int local_a28;
  uint16_t cmd_bits [64];
  uint8_t local_8f8 [64];
  uint8_t local_8b8 [64];
  uint8_t local_878 [64];
  uint8_t local_838 [64];
  uint8_t auStack_7f8 [128];
  uint8_t local_778 [64];
  uint8_t auStack_738 [256];
  uint16_t lit_bits [256];
  uint32_t lit_histo [256];
  
  memset(lit_depths,0,0x100);
  memset(lit_bits,0,0x200);
  memset(lit_histo,0,0x400);
  for (sVar4 = 0; num_literals != sVar4; sVar4 = sVar4 + 1) {
    lit_histo[literals[sVar4]] = lit_histo[literals[sVar4]] + 1;
  }
  BuildAndStoreHuffmanTreeFast(lit_histo,num_literals,8,lit_depths,lit_bits,storage_ix,storage);
  cmd_depths[0x70] = '\0';
  cmd_depths[0x71] = '\0';
  cmd_depths[0x72] = '\0';
  cmd_depths[0x73] = '\0';
  cmd_depths[0x74] = '\0';
  cmd_depths[0x75] = '\0';
  cmd_depths[0x76] = '\0';
  cmd_depths[0x77] = '\0';
  cmd_depths[0x78] = '\0';
  cmd_depths[0x79] = '\0';
  cmd_depths[0x7a] = '\0';
  cmd_depths[0x7b] = '\0';
  cmd_depths[0x7c] = '\0';
  cmd_depths[0x7d] = '\0';
  cmd_depths[0x7e] = '\0';
  cmd_depths[0x7f] = '\0';
  cmd_depths[0x60] = '\0';
  cmd_depths[0x61] = '\0';
  cmd_depths[0x62] = '\0';
  cmd_depths[99] = '\0';
  cmd_depths[100] = '\0';
  cmd_depths[0x65] = '\0';
  cmd_depths[0x66] = '\0';
  cmd_depths[0x67] = '\0';
  cmd_depths[0x68] = '\0';
  cmd_depths[0x69] = '\0';
  cmd_depths[0x6a] = '\0';
  cmd_depths[0x6b] = '\0';
  cmd_depths[0x6c] = '\0';
  cmd_depths[0x6d] = '\0';
  cmd_depths[0x6e] = '\0';
  cmd_depths[0x6f] = '\0';
  cmd_depths[0x50] = '\0';
  cmd_depths[0x51] = '\0';
  cmd_depths[0x52] = '\0';
  cmd_depths[0x53] = '\0';
  cmd_depths[0x54] = '\0';
  cmd_depths[0x55] = '\0';
  cmd_depths[0x56] = '\0';
  cmd_depths[0x57] = '\0';
  cmd_depths[0x58] = '\0';
  cmd_depths[0x59] = '\0';
  cmd_depths[0x5a] = '\0';
  cmd_depths[0x5b] = '\0';
  cmd_depths[0x5c] = '\0';
  cmd_depths[0x5d] = '\0';
  cmd_depths[0x5e] = '\0';
  cmd_depths[0x5f] = '\0';
  cmd_depths[0x40] = '\0';
  cmd_depths[0x41] = '\0';
  cmd_depths[0x42] = '\0';
  cmd_depths[0x43] = '\0';
  cmd_depths[0x44] = '\0';
  cmd_depths[0x45] = '\0';
  cmd_depths[0x46] = '\0';
  cmd_depths[0x47] = '\0';
  cmd_depths[0x48] = '\0';
  cmd_depths[0x49] = '\0';
  cmd_depths[0x4a] = '\0';
  cmd_depths[0x4b] = '\0';
  cmd_depths[0x4c] = '\0';
  cmd_depths[0x4d] = '\0';
  cmd_depths[0x4e] = '\0';
  cmd_depths[0x4f] = '\0';
  cmd_depths[0x30] = '\0';
  cmd_depths[0x31] = '\0';
  cmd_depths[0x32] = '\0';
  cmd_depths[0x33] = '\0';
  cmd_depths[0x34] = '\0';
  cmd_depths[0x35] = '\0';
  cmd_depths[0x36] = '\0';
  cmd_depths[0x37] = '\0';
  cmd_depths[0x38] = '\0';
  cmd_depths[0x39] = '\0';
  cmd_depths[0x3a] = '\0';
  cmd_depths[0x3b] = '\0';
  cmd_depths[0x3c] = '\0';
  cmd_depths[0x3d] = '\0';
  cmd_depths[0x3e] = '\0';
  cmd_depths[0x3f] = '\0';
  cmd_depths[0x20] = '\0';
  cmd_depths[0x21] = '\0';
  cmd_depths[0x22] = '\0';
  cmd_depths[0x23] = '\0';
  cmd_depths[0x24] = '\0';
  cmd_depths[0x25] = '\0';
  cmd_depths[0x26] = '\0';
  cmd_depths[0x27] = '\0';
  cmd_depths[0x28] = '\0';
  cmd_depths[0x29] = '\0';
  cmd_depths[0x2a] = '\0';
  cmd_depths[0x2b] = '\0';
  cmd_depths[0x2c] = '\0';
  cmd_depths[0x2d] = '\0';
  cmd_depths[0x2e] = '\0';
  cmd_depths[0x2f] = '\0';
  cmd_depths[0x10] = '\0';
  cmd_depths[0x11] = '\0';
  cmd_depths[0x12] = '\0';
  cmd_depths[0x13] = '\0';
  cmd_depths[0x14] = '\0';
  cmd_depths[0x15] = '\0';
  cmd_depths[0x16] = '\0';
  cmd_depths[0x17] = '\0';
  cmd_depths[0x18] = '\0';
  cmd_depths[0x19] = '\0';
  cmd_depths[0x1a] = '\0';
  cmd_depths[0x1b] = '\0';
  cmd_depths[0x1c] = '\0';
  cmd_depths[0x1d] = '\0';
  cmd_depths[0x1e] = '\0';
  cmd_depths[0x1f] = '\0';
  cmd_depths[0] = '\0';
  cmd_depths[1] = '\0';
  cmd_depths[2] = '\0';
  cmd_depths[3] = '\0';
  cmd_depths[4] = '\0';
  cmd_depths[5] = '\0';
  cmd_depths[6] = '\0';
  cmd_depths[7] = '\0';
  cmd_depths[8] = '\0';
  cmd_depths[9] = '\0';
  cmd_depths[10] = '\0';
  cmd_depths[0xb] = '\0';
  cmd_depths[0xc] = '\0';
  cmd_depths[0xd] = '\0';
  cmd_depths[0xe] = '\0';
  cmd_depths[0xf] = '\0';
  local_d38[0x38] = 0;
  local_d38[0x39] = 0;
  local_d38[0x3a] = 0;
  local_d38[0x3b] = 0;
  local_d38[0x3c] = 0;
  local_d38[0x3d] = 0;
  local_d38[0x3e] = 0;
  local_d38[0x3f] = 0;
  local_d38[0x30] = 0;
  local_d38[0x31] = 0;
  local_d38[0x32] = 0;
  local_d38[0x33] = 0;
  local_d38[0x34] = 0;
  local_d38[0x35] = 0;
  local_d38[0x36] = 0;
  local_d38[0x37] = 0;
  local_d38[0x28] = 0;
  local_d38[0x29] = 0;
  local_d38[0x2a] = 0;
  local_d38[0x2b] = 0;
  local_d38[0x2c] = 0;
  local_d38[0x2d] = 0;
  local_d38[0x2e] = 0;
  local_d38[0x2f] = 0;
  local_d38[0x20] = 0;
  local_d38[0x21] = 0;
  local_d38[0x22] = 0;
  local_d38[0x23] = 0;
  local_d38[0x24] = 0;
  local_d38[0x25] = 0;
  local_d38[0x26] = 0;
  local_d38[0x27] = 0;
  local_d38[0x18] = 0;
  local_d38[0x19] = 0;
  local_d38[0x1a] = 0;
  local_d38[0x1b] = 0;
  local_d38[0x1c] = 0;
  local_d38[0x1d] = 0;
  local_d38[0x1e] = 0;
  local_d38[0x1f] = 0;
  local_d38[0x10] = 0;
  local_d38[0x11] = 0;
  local_d38[0x12] = 0;
  local_d38[0x13] = 0;
  local_d38[0x14] = 0;
  local_d38[0x15] = 0;
  local_d38[0x16] = 0;
  local_d38[0x17] = 0;
  local_d38[8] = 0;
  local_d38[9] = 0;
  local_d38[10] = 0;
  local_d38[0xb] = 0;
  local_d38[0xc] = 0;
  local_d38[0xd] = 0;
  local_d38[0xe] = 0;
  local_d38[0xf] = 0;
  local_d38[0] = 0;
  local_d38[1] = 0;
  local_d38[2] = 0;
  local_d38[3] = 0;
  local_d38[4] = 0;
  local_d38[5] = 0;
  local_d38[6] = 0;
  local_d38[7] = 0;
  memset(&local_b78,0,0x200);
  for (sVar4 = 0; num_commands != sVar4; sVar4 = sVar4 + 1) {
    (&local_b78)[(byte)commands[sVar4]] = (&local_b78)[(byte)commands[sVar4]] + 1;
  }
  local_b74 = CONCAT44((int)((ulong)local_b74 >> 0x20) + 1,(int)local_b74 + 1);
  local_a78[0] = local_a78[0] + 1;
  local_a28 = local_a28 + 1;
  CreateHuffmanTree(&local_b78,0x40,0xf,cmd_depths);
  depth = cmd_depths + 0x40;
  CreateHuffmanTree(local_a78,0x40,0xe,depth);
  cmd_depth[0] = cmd_depths[0x18];
  cmd_depth[1] = cmd_depths[0x19];
  cmd_depth[2] = cmd_depths[0x1a];
  cmd_depth[3] = cmd_depths[0x1b];
  cmd_depth[4] = cmd_depths[0x1c];
  cmd_depth[5] = cmd_depths[0x1d];
  cmd_depth[6] = cmd_depths[0x1e];
  cmd_depth[7] = cmd_depths[0x1f];
  cmd_depth[8] = cmd_depths[0x20];
  cmd_depth[9] = cmd_depths[0x21];
  cmd_depth[10] = cmd_depths[0x22];
  cmd_depth[0xb] = cmd_depths[0x23];
  cmd_depth[0xc] = cmd_depths[0x24];
  cmd_depth[0xd] = cmd_depths[0x25];
  cmd_depth[0xe] = cmd_depths[0x26];
  cmd_depth[0xf] = cmd_depths[0x27];
  cmd_depth[0x10] = cmd_depths[0x28];
  cmd_depth[0x11] = cmd_depths[0x29];
  cmd_depth[0x12] = cmd_depths[0x2a];
  cmd_depth[0x13] = cmd_depths[0x2b];
  cmd_depth[0x14] = cmd_depths[0x2c];
  cmd_depth[0x15] = cmd_depths[0x2d];
  cmd_depth[0x16] = cmd_depths[0x2e];
  cmd_depth[0x17] = cmd_depths[0x2f];
  cmd_depth[0x18] = cmd_depths[0];
  cmd_depth[0x19] = cmd_depths[1];
  cmd_depth[0x1a] = cmd_depths[2];
  cmd_depth[0x1b] = cmd_depths[3];
  cmd_depth[0x1c] = cmd_depths[4];
  cmd_depth[0x1d] = cmd_depths[5];
  cmd_depth[0x1e] = cmd_depths[6];
  cmd_depth[0x1f] = cmd_depths[7];
  cmd_depth[0x20] = cmd_depths[0x30];
  cmd_depth[0x21] = cmd_depths[0x31];
  cmd_depth[0x22] = cmd_depths[0x32];
  cmd_depth[0x23] = cmd_depths[0x33];
  cmd_depth[0x24] = cmd_depths[0x34];
  cmd_depth[0x25] = cmd_depths[0x35];
  cmd_depth[0x26] = cmd_depths[0x36];
  cmd_depth[0x27] = cmd_depths[0x37];
  cmd_depth[0x28] = cmd_depths[8];
  cmd_depth[0x29] = cmd_depths[9];
  cmd_depth[0x2a] = cmd_depths[10];
  cmd_depth[0x2b] = cmd_depths[0xb];
  cmd_depth[0x2c] = cmd_depths[0xc];
  cmd_depth[0x2d] = cmd_depths[0xd];
  cmd_depth[0x2e] = cmd_depths[0xe];
  cmd_depth[0x2f] = cmd_depths[0xf];
  cmd_depth[0x30] = cmd_depths[0x38];
  cmd_depth[0x31] = cmd_depths[0x39];
  cmd_depth[0x32] = cmd_depths[0x3a];
  cmd_depth[0x33] = cmd_depths[0x3b];
  cmd_depth[0x34] = cmd_depths[0x3c];
  cmd_depth[0x35] = cmd_depths[0x3d];
  cmd_depth[0x36] = cmd_depths[0x3e];
  cmd_depth[0x37] = cmd_depths[0x3f];
  cmd_depth[0x38] = cmd_depths[0x10];
  cmd_depth[0x39] = cmd_depths[0x11];
  cmd_depth[0x3a] = cmd_depths[0x12];
  cmd_depth[0x3b] = cmd_depths[0x13];
  cmd_depth[0x3c] = cmd_depths[0x14];
  cmd_depth[0x3d] = cmd_depths[0x15];
  cmd_depth[0x3e] = cmd_depths[0x16];
  cmd_depth[0x3f] = cmd_depths[0x17];
  ConvertBitDepthsToSymbols(cmd_depth,0x40,cmd_bits);
  local_db8[0] = cmd_bits[0x18];
  local_db8[1] = cmd_bits[0x19];
  local_db8[2] = cmd_bits[0x1a];
  local_db8[3] = cmd_bits[0x1b];
  auStack_db0[0] = cmd_bits[0x1c];
  auStack_db0[1] = cmd_bits[0x1d];
  auStack_db0[2] = cmd_bits[0x1e];
  auStack_db0[3] = cmd_bits[0x1f];
  local_da8[0] = cmd_bits[0x28];
  local_da8[1] = cmd_bits[0x29];
  local_da8[2] = cmd_bits[0x2a];
  local_da8[3] = cmd_bits[0x2b];
  auStack_da0[0] = cmd_bits[0x2c];
  auStack_da0[1] = cmd_bits[0x2d];
  auStack_da0[2] = cmd_bits[0x2e];
  auStack_da0[3] = cmd_bits[0x2f];
  local_d98[0] = cmd_bits[0x38];
  local_d98[1] = cmd_bits[0x39];
  local_d98[2] = cmd_bits[0x3a];
  local_d98[3] = cmd_bits[0x3b];
  auStack_d90[0] = cmd_bits[0x3c];
  auStack_d90[1] = cmd_bits[0x3d];
  auStack_d90[2] = cmd_bits[0x3e];
  auStack_d90[3] = cmd_bits[0x3f];
  local_d88[0] = cmd_bits[0];
  local_d88[1] = cmd_bits[1];
  local_d88[2] = cmd_bits[2];
  local_d88[3] = cmd_bits[3];
  auStack_d80[0] = cmd_bits[4];
  auStack_d80[1] = cmd_bits[5];
  auStack_d80[2] = cmd_bits[6];
  auStack_d80[3] = cmd_bits[7];
  local_d78[0] = cmd_bits[8];
  local_d78[1] = cmd_bits[9];
  local_d78[2] = cmd_bits[10];
  local_d78[3] = cmd_bits[0xb];
  auStack_d70[0] = cmd_bits[0xc];
  auStack_d70[1] = cmd_bits[0xd];
  auStack_d70[2] = cmd_bits[0xe];
  auStack_d70[3] = cmd_bits[0xf];
  local_d68[0] = cmd_bits[0x10];
  local_d68[1] = cmd_bits[0x11];
  local_d68[2] = cmd_bits[0x12];
  local_d68[3] = cmd_bits[0x13];
  auStack_d60[0] = cmd_bits[0x14];
  auStack_d60[1] = cmd_bits[0x15];
  auStack_d60[2] = cmd_bits[0x16];
  auStack_d60[3] = cmd_bits[0x17];
  local_d58[0] = cmd_bits[0x20];
  local_d58[1] = cmd_bits[0x21];
  local_d58[2] = cmd_bits[0x22];
  local_d58[3] = cmd_bits[0x23];
  auStack_d50[0] = cmd_bits[0x24];
  auStack_d50[1] = cmd_bits[0x25];
  auStack_d50[2] = cmd_bits[0x26];
  auStack_d50[3] = cmd_bits[0x27];
  local_d48[0] = cmd_bits[0x30];
  local_d48[1] = cmd_bits[0x31];
  local_d48[2] = cmd_bits[0x32];
  local_d48[3] = cmd_bits[0x33];
  auStack_d40[0] = cmd_bits[0x34];
  auStack_d40[1] = cmd_bits[0x35];
  auStack_d40[2] = cmd_bits[0x36];
  auStack_d40[3] = cmd_bits[0x37];
  ConvertBitDepthsToSymbols(depth,0x40,local_d38);
  memset(local_8f8,0,0x2c0);
  local_8f8[0] = cmd_depths[0x18];
  local_8f8[1] = cmd_depths[0x19];
  local_8f8[2] = cmd_depths[0x1a];
  local_8f8[3] = cmd_depths[0x1b];
  local_8f8[4] = cmd_depths[0x1c];
  local_8f8[5] = cmd_depths[0x1d];
  local_8f8[6] = cmd_depths[0x1e];
  local_8f8[7] = cmd_depths[0x1f];
  local_8b8[0] = cmd_depths[0x20];
  local_8b8[1] = cmd_depths[0x21];
  local_8b8[2] = cmd_depths[0x22];
  local_8b8[3] = cmd_depths[0x23];
  local_8b8[4] = cmd_depths[0x24];
  local_8b8[5] = cmd_depths[0x25];
  local_8b8[6] = cmd_depths[0x26];
  local_8b8[7] = cmd_depths[0x27];
  local_878[0] = cmd_depths[0x28];
  local_878[1] = cmd_depths[0x29];
  local_878[2] = cmd_depths[0x2a];
  local_878[3] = cmd_depths[0x2b];
  local_878[4] = cmd_depths[0x2c];
  local_878[5] = cmd_depths[0x2d];
  local_878[6] = cmd_depths[0x2e];
  local_878[7] = cmd_depths[0x2f];
  local_838[0] = cmd_depths[0x30];
  local_838[1] = cmd_depths[0x31];
  local_838[2] = cmd_depths[0x32];
  local_838[3] = cmd_depths[0x33];
  local_838[4] = cmd_depths[0x34];
  local_838[5] = cmd_depths[0x35];
  local_838[6] = cmd_depths[0x36];
  local_838[7] = cmd_depths[0x37];
  local_778[0] = cmd_depths[0x38];
  local_778[1] = cmd_depths[0x39];
  local_778[2] = cmd_depths[0x3a];
  local_778[3] = cmd_depths[0x3b];
  local_778[4] = cmd_depths[0x3c];
  local_778[5] = cmd_depths[0x3d];
  local_778[6] = cmd_depths[0x3e];
  local_778[7] = cmd_depths[0x3f];
  for (lVar5 = 0; lVar5 != 8; lVar5 = lVar5 + 1) {
    uVar1 = cmd_depths[lVar5 + 8];
    local_878[lVar5 * 8] = cmd_depths[lVar5];
    auStack_7f8[lVar5 * 8] = uVar1;
    auStack_738[lVar5 * 8] = cmd_depths[lVar5 + 0x10];
  }
  StoreHuffmanTree(local_8f8,0x2c0,storage_ix,storage);
  StoreHuffmanTree(depth,0x40,storage_ix,storage);
  for (sVar4 = 0; sVar4 != num_commands; sVar4 = sVar4 + 1) {
    uVar6 = commands[sVar4] & 0xff;
    uVar2 = commands[sVar4] >> 8;
    WriteBits((ulong)cmd_depths[uVar6],(ulong)local_db8[uVar6],storage_ix,storage);
    WriteBits((ulong)StoreCommands::kNumExtraBits[uVar6],(ulong)uVar2,storage_ix,storage);
    if (uVar6 < 0x18) {
      iVar3 = uVar2 + StoreCommands::kInsertOffset[uVar6];
      while (bVar7 = iVar3 != 0, iVar3 = iVar3 + -1, bVar7) {
        WriteBits((ulong)lit_depths[*literals],(ulong)lit_bits[*literals],storage_ix,storage);
        literals = literals + 1;
      }
    }
  }
  return;
}

Assistant:

void StoreCommands(const uint8_t* literals, const size_t num_literals,
                   const uint32_t* commands, const size_t num_commands,
                   size_t* storage_ix, uint8_t* storage) {
  uint8_t lit_depths[256] = { 0 };
  uint16_t lit_bits[256] = { 0 };
  uint32_t lit_histo[256] = { 0 };
  for (size_t i = 0; i < num_literals; ++i) {
    ++lit_histo[literals[i]];
  }
  BuildAndStoreHuffmanTreeFast(lit_histo, num_literals,
                               /* max_bits = */ 8,
                               lit_depths, lit_bits,
                               storage_ix, storage);

  uint8_t cmd_depths[128] = { 0 };
  uint16_t cmd_bits[128] = { 0 };
  uint32_t cmd_histo[128] = { 0 };
  for (size_t i = 0; i < num_commands; ++i) {
    ++cmd_histo[commands[i] & 0xff];
  }
  cmd_histo[1] += 1;
  cmd_histo[2] += 1;
  cmd_histo[64] += 1;
  cmd_histo[84] += 1;
  BuildAndStoreCommandPrefixCode(cmd_histo, cmd_depths, cmd_bits,
                                 storage_ix, storage);

  static const uint32_t kNumExtraBits[128] = {
    0, 0, 0, 0, 0, 0, 1, 1, 2, 2, 3, 3, 4, 4, 5, 5, 6, 7, 8, 9, 10, 12, 14, 24,
    0, 0, 0, 0, 0, 0, 0, 0, 1, 1, 2, 2, 3, 3, 4, 4,
    0, 0, 0, 0, 0, 0, 0, 0, 1, 1, 2, 2, 3, 3, 4, 4, 5, 5, 6, 7, 8, 9, 10, 24,
    0, 0, 0, 0, 0, 0, 0, 0, 0, 0, 0, 0, 0, 0, 0, 0,
    1, 1, 2, 2, 3, 3, 4, 4, 5, 5, 6, 6, 7, 7, 8, 8,
    9, 9, 10, 10, 11, 11, 12, 12, 13, 13, 14, 14, 15, 15, 16, 16,
    17, 17, 18, 18, 19, 19, 20, 20, 21, 21, 22, 22, 23, 23, 24, 24,
  };
  static const uint32_t kInsertOffset[24] = {
    0, 1, 2, 3, 4, 5, 6, 8, 10, 14, 18, 26, 34, 50, 66, 98, 130, 194, 322, 578,
    1090, 2114, 6210, 22594,
  };

  for (size_t i = 0; i < num_commands; ++i) {
    const uint32_t cmd = commands[i];
    const uint32_t code = cmd & 0xff;
    const uint32_t extra = cmd >> 8;
    WriteBits(cmd_depths[code], cmd_bits[code], storage_ix, storage);
    WriteBits(kNumExtraBits[code], extra, storage_ix, storage);
    if (code < 24) {
      const uint32_t insert = kInsertOffset[code] + extra;
      for (uint32_t j = 0; j < insert; ++j) {
        const uint8_t lit = *literals;
        WriteBits(lit_depths[lit], lit_bits[lit], storage_ix, storage);
        ++literals;
      }
    }
  }
}